

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O0

size_type __thiscall
lf::uscalfe::UniformScalarFESpace<double>::NumRefShapeFunctions
          (UniformScalarFESpace<double> *this,RefEl ref_el_type)

{
  bool bVar1;
  RefElType RVar2;
  runtime_error *this_00;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  stringstream local_420 [8];
  stringstream ss_1;
  ostream local_410 [383];
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  UniformScalarFESpace<double> *local_18;
  UniformScalarFESpace<double> *this_local;
  RefEl ref_el_type_local;
  
  local_18 = this;
  this_local._3_1_ = ref_el_type.type_;
  bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0);
  if ((((bVar1 ^ 0xffU) & 1) != 0) &&
     (bVar1 = std::operator==(&this->rfs_quad_p_,(nullptr_t)0x0), ((bVar1 ^ 0xffU) & 1) != 0)) {
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&this_local + 3));
    switch(RVar2) {
    case kPoint:
      this_local._4_4_ = this->num_rsf_node_;
      break;
    case kSegment:
      this_local._4_4_ = this->num_rsf_edge_;
      break;
    case kTria:
      this_local._4_4_ = this->num_rsf_tria_;
      break;
    case kQuad:
      this_local._4_4_ = this->num_rsf_quad_;
      break;
    default:
      std::__cxx11::stringstream::stringstream(local_420);
      std::operator<<(local_410,"Illegal entity type");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"false",&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
                 ,&local_469);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_440,&local_468,0x19d,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator(&local_469);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    return this_local._4_4_;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"No valid FE space object: no rsfs");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"(rfs_quad_p_ != nullptr) && (rfs_quad_p_ != nullptr)",&local_1d1)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
             ,&local_1f9);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1d0,&local_1f8,0x18d,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/uniform_scalar_fe_space.h"
             ,&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
  lf::base::AssertionFailed(&local_240,&local_268,0x18d,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  abort();
}

Assistant:

size_type UniformScalarFESpace<SCALAR>::NumRefShapeFunctions(
    lf::base::RefEl ref_el_type) const {
  LF_ASSERT_MSG((rfs_quad_p_ != nullptr) && (rfs_quad_p_ != nullptr),
                "No valid FE space object: no rsfs");
  // Retrieve number of interior shape functions from rsf layouts
  switch (ref_el_type) {
    case lf::base::RefEl::kPoint(): {
      return num_rsf_node_;
    }
    case lf::base::RefEl::kSegment(): {
      return num_rsf_edge_;
    }
    case lf::base::RefEl::kTria(): {
      return num_rsf_tria_;
    }
    case lf::base::RefEl::kQuad(): {
      return num_rsf_quad_;
    }
    default: {
      LF_VERIFY_MSG(false, "Illegal entity type");
    }
  }
  return 0;
}